

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

string * __thiscall
Json::valueToQuotedString_abi_cxx11_(string *__return_storage_ptr__,Json *this,char *value)

{
  Json JVar1;
  long lVar2;
  char *pcVar3;
  Json *pJVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  ostringstream oss;
  undefined1 auStack_1d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long alStack_190 [11];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  if (this == (Json *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  pcVar3 = strpbrk((char *)this,"\"\\\b\f\n\r\t");
  pJVar4 = this;
  if (pcVar3 == (char *)0x0) {
    do {
      JVar1 = *pJVar4;
      pJVar4 = pJVar4 + 1;
    } while (0x1f < (byte)JVar1);
    if (JVar1 == (Json)0x0) {
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"\"","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_1c8);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_198 = *plVar6;
        alStack_190[0] = plVar5[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar6;
        local_1a8 = (long *)*plVar5;
      }
      local_1a0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8);
      }
      if (local_1c8[0] == local_1b8) {
        return __return_storage_ptr__;
      }
      operator_delete(local_1c8[0]);
      return __return_storage_ptr__;
    }
  }
  strlen((char *)this);
  local_1d0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  do {
    JVar1 = *this;
    switch(JVar1) {
    case (Json)0x0:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    case (Json)0x1:
    case (Json)0x2:
    case (Json)0x3:
    case (Json)0x4:
    case (Json)0x5:
    case (Json)0x6:
    case (Json)0x7:
    case (Json)0xb:
      goto switchD_0010eb65_caseD_1;
    case (Json)0x8:
      break;
    case (Json)0x9:
      break;
    case (Json)0xa:
      break;
    case (Json)0xc:
      break;
    case (Json)0xd:
      break;
    default:
      if ((JVar1 == (Json)0x22) || (JVar1 == (Json)0x5c)) break;
      goto switchD_0010eb65_caseD_1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0010eca7:
    this = this + 1;
  } while( true );
switchD_0010eb65_caseD_1:
  if ((byte)((char)JVar1 - 1U) < 0x1f) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\\u",2);
    *(uint *)((long)alStack_190 + local_1a8[-3]) =
         *(uint *)((long)alStack_190 + local_1a8[-3]) & 0xffffffb5 | 8;
    *(uint *)((long)alStack_190 + local_1a8[-3]) =
         *(uint *)((long)alStack_190 + local_1a8[-3]) | 0x4000;
    lVar2 = local_1a8[-3];
    if (acStack_c8[lVar2 + 1] == '\0') {
      std::ios::widen((char)auStack_1d8 + (char)lVar2 + '0');
      acStack_c8[lVar2 + 1] = '\x01';
    }
    acStack_c8[lVar2] = '0';
    *(undefined8 *)((long)alStack_190 + local_1a8[-3] + -8) = 4;
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)(char)*this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1c8[0]);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  goto LAB_0010eca7;
}

Assistant:

JSONCPP_STRING valueToQuotedString(const char* value) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strpbrk(value, "\"\\\b\f\n\r\t") == NULL &&
      !containsControlCharacter(value))
    return JSONCPP_STRING("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to JSONCPP_STRING is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  JSONCPP_STRING::size_type maxsize =
      strlen(value) * 2 + 3; // allescaped+quotes+NULL
  JSONCPP_STRING result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  for (const char* c = value; *c != 0; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if (isControlCharacter(*c)) {
        JSONCPP_OSTRINGSTREAM oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}